

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O2

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
          (StateQueryMemoryWriteGuard<unsigned_char> *this,TestContext *testCtx)

{
  ostringstream *this_00;
  qpTestResult qVar1;
  char *description;
  MessageBuilder local_190;
  
  if (this->m_preguard == 0xde) {
    if (this->m_postguard == 0xde) {
      if (this->m_value != 0xde) {
        return true;
      }
      local_190.m_log = testCtx->m_log;
      this_00 = &local_190.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,"// ERROR: Get* did not return a value");
      tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      qVar1 = testCtx->m_testResult;
      description = "Get* did not return a value";
      goto LAB_0039b4b1;
    }
    local_190.m_log = testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190.m_str);
    std::operator<<((ostream *)&local_190.m_str,"// ERROR: Post-guard value was modified ");
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_190.m_log = testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190.m_str);
    std::operator<<((ostream *)&local_190.m_str,"// ERROR: Pre-guard value was modified ");
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190.m_str);
  qVar1 = testCtx->m_testResult;
  description = "Get* did an illegal memory write";
LAB_0039b4b1:
  if ((qVar1 == QP_TEST_RESULT_PASS) || (qVar1 == QP_TEST_RESULT_LAST)) {
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,description);
  }
  return false;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::verifyValidity (tcu::TestContext& testCtx) const
{
	using tcu::TestLog;

	if (isPreguardContaminated())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Pre-guard value was modified " << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did an illegal memory write");

		return false;
	}
	else if (isPostguardContaminated())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Post-guard value was modified " << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did an illegal memory write");

		return false;
	}
	else if (isUndefined())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Get* did not return a value" << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did not return a value");

		return false;
	}

	return true;
}